

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O1

void SequenceSpanTask::initialize(search *sch,size_t *num_actions,options_i *options)

{
  v_array<unsigned_int> *this;
  options_i *poVar1;
  int *piVar2;
  option_group_definition *this_00;
  typed_option<unsigned_long> *ptVar3;
  bool search_span_bilou;
  option_group_definition new_options;
  bool local_3a1;
  search *local_3a0;
  unsigned_long *local_398;
  options_i *local_390;
  undefined1 *local_388 [2];
  undefined1 local_378 [16];
  string local_368;
  option_group_definition local_348;
  undefined1 *local_310 [2];
  undefined1 local_300 [16];
  string local_2f0;
  undefined1 local_2d0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_248;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_238;
  undefined1 *local_230;
  long local_228;
  undefined1 local_220 [16];
  typed_option<unsigned_long> local_210;
  typed_option<unsigned_long> local_170;
  typed_option<bool> local_d0;
  
  local_3a0 = sch;
  piVar2 = (int *)operator_new(0x50);
  piVar2[0] = 0;
  piVar2[1] = 0;
  piVar2[2] = 0;
  piVar2[3] = 0;
  piVar2[4] = 0;
  piVar2[5] = 0;
  piVar2[6] = 0;
  piVar2[7] = 0;
  piVar2[8] = 0;
  piVar2[9] = 0;
  piVar2[10] = 0;
  piVar2[0xb] = 0;
  piVar2[0xc] = 0;
  piVar2[0xd] = 0;
  piVar2[0xe] = 0;
  piVar2[0xf] = 0;
  piVar2[0x10] = 0;
  piVar2[0x11] = 0;
  piVar2[0x12] = 0;
  piVar2[0x13] = 0;
  local_3a1 = false;
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,"search sequencespan options","");
  local_348.m_name._M_dataplus._M_p = (pointer)&local_348.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_348,local_230,local_230 + local_228);
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_230 != local_220) {
    operator_delete(local_230);
  }
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"search_span_bilou","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2d0,&local_368,&local_3a1);
  local_388[0] = local_378;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_388,"switch to (internal) BILOU encoding instead of BIO encoding","");
  std::__cxx11::string::_M_assign((string *)(local_2d0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_2d0);
  local_390 = options;
  this_00 = VW::config::option_group_definition::add<bool>(&local_348,&local_d0);
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"search_span_multipass","");
  local_398 = (unsigned_long *)(piVar2 + 0x12);
  VW::config::typed_option<unsigned_long>::typed_option(&local_210,&local_2f0,local_398);
  ptVar3 = VW::config::typed_option<unsigned_long>::default_value(&local_210,1);
  local_310[0] = local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"do multiple passes","");
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_170,ptVar3);
  VW::config::option_group_definition::add<unsigned_long>(this_00,&local_170);
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d2088;
  if (local_170.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_310[0] != local_300) {
    operator_delete(local_310[0]);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d2088;
  if (local_210.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  poVar1 = local_390;
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1fe8;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_388[0] != local_378) {
    operator_delete(local_388[0]);
  }
  local_2d0._0_8_ = &PTR__typed_option_002d1fe8;
  if (local_238._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238._M_pi);
  }
  if (local_248._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_248._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  (**poVar1->_vptr_options_i)(poVar1,&local_348);
  if (local_3a1 == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"switching to BILOU encoding for sequence span labeling",0x36);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    *piVar2 = 1;
    *num_actions = *num_actions * 2 - 1;
  }
  else {
    *piVar2 = 0;
  }
  this = (v_array<unsigned_int> *)(piVar2 + 2);
  v_array<unsigned_int>::clear(this);
  if (*piVar2 == 1) {
    local_2d0._0_4_ = 1;
    v_array<unsigned_int>::push_back(this,(uint *)local_2d0);
    local_2d0._0_4_ = 2;
    if (2 < *num_actions) {
      do {
        v_array<unsigned_int>::push_back(this,(uint *)local_2d0);
        local_210.super_base_option._vptr_base_option =
             (_func_int **)
             CONCAT44(local_210.super_base_option._vptr_base_option._4_4_,local_2d0._0_4_ + 1);
        v_array<unsigned_int>::push_back(this,(uint *)&local_210);
        local_2d0._0_4_ = local_2d0._0_4_ + 4;
      } while ((ulong)(uint)local_2d0._0_4_ < *num_actions);
    }
    local_2d0._0_4_ = 0;
    v_array<unsigned_int>::push_back((v_array<unsigned_int> *)(piVar2 + 10),(uint *)local_2d0);
    local_2d0._0_8_ = (ulong)(uint)local_2d0._4_4_ << 0x20;
    v_array<unsigned_int>::push_back((v_array<unsigned_int> *)(piVar2 + 10),(uint *)local_2d0);
  }
  else if (*piVar2 == 0) {
    local_2d0._0_4_ = 1;
    v_array<unsigned_int>::push_back(this,(uint *)local_2d0);
    local_2d0._0_4_ = 2;
    if (2 < *num_actions) {
      do {
        v_array<unsigned_int>::push_back(this,(uint *)local_2d0);
        local_2d0._0_4_ = local_2d0._0_4_ + 2;
      } while ((ulong)(uint)local_2d0._0_4_ < *num_actions);
    }
    local_2d0._0_4_ = 1;
    v_array<unsigned_int>::push_back(this,(uint *)local_2d0);
  }
  local_3a0->task_data = piVar2;
  Search::search::set_options
            (local_3a0,
             Search::AUTO_HAMMING_LOSS | Search::AUTO_CONDITION_FEATURES |
             Search::EXAMPLES_DONT_CHANGE);
  Search::search::set_num_learners(local_3a0,*local_398);
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_348.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.m_name._M_dataplus._M_p != &local_348.m_name.field_2) {
    operator_delete(local_348.m_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& num_actions, options_i& options)
{
  task_data* D = new task_data();

  bool search_span_bilou = false;
  option_group_definition new_options("search sequencespan options");
  new_options
      .add(make_option("search_span_bilou", search_span_bilou)
               .help("switch to (internal) BILOU encoding instead of BIO encoding"))
      .add(make_option("search_span_multipass", D->multipass).default_value(1).help("do multiple passes"));
  options.add_and_parse(new_options);

  if (search_span_bilou)
  {
    cerr << "switching to BILOU encoding for sequence span labeling" << endl;
    D->encoding = BILOU;
    num_actions = num_actions * 2 - 1;
  }
  else
    D->encoding = BIO;

  D->allowed_actions.clear();

  if (D->encoding == BIO)
  {
    D->allowed_actions.push_back(1);
    for (action l = 2; l < num_actions; l += 2) D->allowed_actions.push_back(l);
    D->allowed_actions.push_back(1);  // push back an extra 1 that we can overwrite later if we want
  }
  else if (D->encoding == BILOU)
  {
    D->allowed_actions.push_back(1);
    for (action l = 2; l < num_actions; l += 4)
    {
      D->allowed_actions.push_back(l);
      D->allowed_actions.push_back(l + 1);
    }
    D->only_two_allowed.push_back(0);
    D->only_two_allowed.push_back(0);
  }

  sch.set_task_data<task_data>(D);
  sch.set_options(Search::AUTO_CONDITION_FEATURES |  // automatically add history features to our examples, please
      Search::AUTO_HAMMING_LOSS |     // please just use hamming loss on individual predictions -- we won't declare loss
      Search::EXAMPLES_DONT_CHANGE |  // we don't do any internal example munging
      0);
  sch.set_num_learners(D->multipass);
}